

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_ameth.c
# Opt level: O0

int dsa_copy_parameters(EVP_PKEY *to,EVP_PKEY *from)

{
  int iVar1;
  DSA *pDVar2;
  FFC_PARAMS *in_RSI;
  long in_RDI;
  uint local_4;
  
  if (*(long *)(in_RDI + 0x20) == 0) {
    pDVar2 = DSA_new();
    *(DSA **)(in_RDI + 0x20) = pDVar2;
    if (*(long *)(in_RDI + 0x20) == 0) {
      return 0;
    }
  }
  iVar1 = ossl_ffc_params_copy(in_RSI,(FFC_PARAMS *)0x3bc140);
  if (iVar1 != 0) {
    *(long *)(*(long *)(in_RDI + 0x20) + 0xb8) = *(long *)(*(long *)(in_RDI + 0x20) + 0xb8) + 1;
  }
  local_4 = (uint)(iVar1 != 0);
  return local_4;
}

Assistant:

static int dsa_copy_parameters(EVP_PKEY *to, const EVP_PKEY *from)
{
    if (to->pkey.dsa == NULL) {
        to->pkey.dsa = DSA_new();
        if (to->pkey.dsa == NULL)
            return 0;
    }
    if (!ossl_ffc_params_copy(&to->pkey.dsa->params, &from->pkey.dsa->params))
        return 0;

    to->pkey.dsa->dirty_cnt++;
    return 1;
}